

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

Statement *
slang::ast::WaitStatement::fromSyntax
          (Compilation *compilation,WaitStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  Expression *args;
  StatementContext *pSVar1;
  WaitStatementSyntax *this;
  bool bVar2;
  int iVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  StatementSyntax *pSVar5;
  undefined4 extraout_var_00;
  Statement *pSVar6;
  bitmask<slang::ast::StatementFlags> *this_00;
  SourceRange sourceRange;
  bool local_a9;
  bitmask<slang::ast::ASTFlags> local_68;
  SourceRange local_60;
  WaitStatement *local_50;
  WaitStatement *result;
  Statement *stmt;
  Expression *local_38;
  Expression *cond;
  StatementContext *stmtCtx_local;
  ASTContext *context_local;
  WaitStatementSyntax *syntax_local;
  Compilation *compilation_local;
  
  cond = (Expression *)stmtCtx;
  stmtCtx_local = (StatementContext *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (WaitStatementSyntax *)compilation;
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->expr);
  pSVar1 = stmtCtx_local;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&stmt,None);
  iVar3 = Expression::bind((int)pEVar4,(sockaddr *)pSVar1,(socklen_t)stmt);
  local_38 = (Expression *)CONCAT44(extraout_var,iVar3);
  pSVar5 = not_null<slang::syntax::StatementSyntax_*>::operator*
                     ((not_null<slang::syntax::StatementSyntax_*> *)&context_local[2].flags);
  iVar3 = Statement::bind((int)pSVar5,(sockaddr *)stmtCtx_local,(socklen_t)cond);
  this = syntax_local;
  args = local_38;
  result = (WaitStatement *)CONCAT44(extraout_var_00,iVar3);
  local_60 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  local_50 = BumpAllocator::
             emplace<slang::ast::WaitStatement,slang::ast::Expression_const&,slang::ast::Statement_const&,slang::SourceRange>
                       ((BumpAllocator *)this,args,(Statement *)CONCAT44(extraout_var_00,iVar3),
                        &local_60);
  bVar2 = Expression::bad(local_38);
  if ((bVar2) || (bVar2 = Statement::bad(&result->super_Statement), bVar2)) {
    pSVar6 = Statement::badStmt((Compilation *)syntax_local,&local_50->super_Statement);
    return pSVar6;
  }
  bVar2 = ASTContext::requireBooleanConvertible((ASTContext *)stmtCtx_local,local_38);
  if (!bVar2) {
    pSVar6 = Statement::badStmt((Compilation *)syntax_local,&local_50->super_Statement);
    return pSVar6;
  }
  this_00 = &stmtCtx_local->flags;
  local_68 = ast::operator|(Function,Final);
  bVar2 = bitmask<slang::ast::ASTFlags>::has((bitmask<slang::ast::ASTFlags> *)this_00,&local_68);
  local_a9 = true;
  if (!bVar2) {
    local_a9 = ASTContext::inAlwaysCombLatch((ASTContext *)stmtCtx_local);
  }
  pSVar1 = stmtCtx_local;
  if (local_a9 == false) {
    return &local_50->super_Statement;
  }
  sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  ASTContext::addDiag((ASTContext *)pSVar1,(DiagCode)0x460008,sourceRange);
  pSVar6 = Statement::badStmt((Compilation *)syntax_local,&local_50->super_Statement);
  return pSVar6;
}

Assistant:

Statement& WaitStatement::fromSyntax(Compilation& compilation, const WaitStatementSyntax& syntax,
                                     const ASTContext& context, StatementContext& stmtCtx) {
    auto& cond = Expression::bind(*syntax.expr, context);
    auto& stmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<WaitStatement>(cond, stmt, syntax.sourceRange());
    if (cond.bad() || stmt.bad())
        return badStmt(compilation, result);

    if (!context.requireBooleanConvertible(cond))
        return badStmt(compilation, result);

    if (context.flags.has(ASTFlags::Function | ASTFlags::Final) || context.inAlwaysCombLatch()) {
        context.addDiag(diag::TimingInFuncNotAllowed, syntax.sourceRange());
        return badStmt(compilation, result);
    }

    return *result;
}